

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O0

Transform * __thiscall
iDynTree::SimpleLeggedOdometry::getWorldFrameTransform
          (SimpleLeggedOdometry *this,FrameIndex frame_index)

{
  ulong uVar1;
  long in_RSI;
  Transform *in_RDI;
  Transform link_H_frame;
  LinkIndex in_stack_000000a0;
  SimpleLeggedOdometry *in_stack_000000a8;
  LinkIndex linkIndex;
  Transform local_e0 [96];
  undefined1 local_80 [96];
  undefined8 local_20;
  
  if (((*(byte *)(in_RSI + 0x191) & 1) == 0) || ((*(byte *)(in_RSI + 0x192) & 1) == 0)) {
    iDynTree::reportError
              ("SimpleLeggedOdometry","getWorldFrameTransform",
               "getWorldLinkTransform was called, but the kinematics update or the odometry init was never setted."
              );
    iDynTree::Transform::Identity();
  }
  else {
    uVar1 = iDynTree::Model::isValidFrameIndex(in_RSI);
    if ((uVar1 & 1) == 0) {
      iDynTree::reportError
                ("SimpleLeggedOdometry","getWorldFrameTransform",
                 "getWorldLinkTransform was called, but the request linkindex is not part of the model"
                );
      iDynTree::Transform::Identity();
    }
    else {
      local_20 = iDynTree::Model::getFrameLink(in_RSI);
      iDynTree::Model::getFrameTransform((long)local_80);
      getWorldLinkTransform(in_stack_000000a8,in_stack_000000a0);
      iDynTree::Transform::operator*(in_RDI,local_e0);
    }
  }
  return in_RDI;
}

Assistant:

Transform SimpleLeggedOdometry::getWorldFrameTransform(const FrameIndex frame_index)
{
    if( !this->m_kinematicsUpdated || !this->m_isOdometryInitialized  )
    {
        reportError("SimpleLeggedOdometry",
                    "getWorldFrameTransform",
                    "getWorldLinkTransform was called, but the kinematics update or the odometry init was never setted.");
        return Transform::Identity();
    }

    if( !this->m_model.isValidFrameIndex(frame_index) )
    {
        reportError("SimpleLeggedOdometry",
                    "getWorldFrameTransform",
                    "getWorldLinkTransform was called, but the request linkindex is not part of the model");
        return Transform::Identity();
    }

    LinkIndex linkIndex = this->m_model.getFrameLink(frame_index);
    Transform link_H_frame = m_model.getFrameTransform(frame_index);
    return getWorldLinkTransform(linkIndex) * link_H_frame;
}